

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strnid.c
# Opt level: O0

int ASN1_STRING_set_default_mask_asc(char *p)

{
  int iVar1;
  char *end;
  unsigned_long mask;
  char *local_20;
  ulong local_18;
  char *local_10;
  
  local_10 = p;
  iVar1 = strncmp(p,"MASK:",5);
  if (iVar1 == 0) {
    if (local_10[5] == '\0') {
      return 0;
    }
    local_18 = strtoul(local_10 + 5,&local_20,0);
    if (*local_20 != '\0') {
      return 0;
    }
  }
  else {
    iVar1 = strcmp(local_10,"nombstr");
    if (iVar1 == 0) {
      local_18 = 0xffffffffffffd7ff;
    }
    else {
      iVar1 = strcmp(local_10,"pkix");
      if (iVar1 == 0) {
        local_18 = 0xfffffffffffffffb;
      }
      else {
        iVar1 = strcmp(local_10,"utf8only");
        if (iVar1 == 0) {
          local_18 = 0x2000;
        }
        else {
          iVar1 = strcmp(local_10,"default");
          if (iVar1 != 0) {
            return 0;
          }
          local_18 = 0xffffffff;
        }
      }
    }
  }
  ASN1_STRING_set_default_mask(local_18);
  return 1;
}

Assistant:

int ASN1_STRING_set_default_mask_asc(const char *p)
{
    unsigned long mask;
    char *end;

    if (strncmp(p, "MASK:", 5) == 0) {
        if (p[5] == '\0')
            return 0;
        mask = strtoul(p + 5, &end, 0);
        if (*end)
            return 0;
    } else if (strcmp(p, "nombstr") == 0)
        mask = ~((unsigned long)(B_ASN1_BMPSTRING | B_ASN1_UTF8STRING));
    else if (strcmp(p, "pkix") == 0)
        mask = ~((unsigned long)B_ASN1_T61STRING);
    else if (strcmp(p, "utf8only") == 0)
        mask = B_ASN1_UTF8STRING;
    else if (strcmp(p, "default") == 0)
        mask = 0xFFFFFFFFL;
    else
        return 0;
    ASN1_STRING_set_default_mask(mask);
    return 1;
}